

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

float GD::sensitivity<false,true,true,0ul,0ul,0ul>(gd *g,base_learner *param_2,example *ec)

{
  float fVar1;
  
  fVar1 = get_scale<0ul>(g,ec,1.0);
  return fVar1 * ec->total_sum_feat_sq;
}

Assistant:

float sensitivity(gd& g, base_learner& /* base */, example& ec)
{
  return get_scale<adaptive>(g, ec, 1.) *
      sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, true>(g, ec);
}